

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseUninterpretedBlock(Parser *this,string *value)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Tokenizer *pTVar5;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  bVar2 = Consume(this,"{");
  if (bVar2) {
    pTVar5 = this->input_;
    if ((pTVar5->current_).type != TYPE_END) {
      iVar4 = 1;
      do {
        iVar3 = std::__cxx11::string::compare((char *)&(pTVar5->current_).text);
        if (iVar3 == 0) {
          iVar4 = iVar4 + 1;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if ((iVar3 == 0) && (iVar4 = iVar4 + -1, iVar4 == 0)) {
            io::Tokenizer::Next(this->input_);
            return true;
          }
        }
        if (value->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)value);
        }
        std::__cxx11::string::_M_append
                  ((char *)value,(ulong)(this->input_->current_).text._M_dataplus._M_p);
        io::Tokenizer::Next(this->input_);
        pTVar5 = this->input_;
      } while ((pTVar5->current_).type != TYPE_END);
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Unexpected end of stream while parsing aggregate value.","");
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,local_48);
    }
    this->had_errors_ = true;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return false;
}

Assistant:

bool Parser::ParseUninterpretedBlock(std::string* value) {
  // Note that enclosing braces are not added to *value.
  // We do NOT use ConsumeEndOfStatement for this brace because it's delimiting
  // an expression, not a block of statements.
  DO(Consume("{"));
  int brace_depth = 1;
  while (!AtEnd()) {
    if (LookingAt("{")) {
      brace_depth++;
    } else if (LookingAt("}")) {
      brace_depth--;
      if (brace_depth == 0) {
        input_->Next();
        return true;
      }
    }
    // TODO(sanjay): Interpret line/column numbers to preserve formatting
    if (!value->empty()) value->push_back(' ');
    value->append(input_->current().text);
    input_->Next();
  }
  AddError("Unexpected end of stream while parsing aggregate value.");
  return false;
}